

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

bool ungroup_selective_repeat_new_allowed_proc
               (Am_Object *command_obj,Am_Value *new_selection,Am_Value *param_3)

{
  bool bVar1;
  Am_Value *pAVar2;
  undefined1 local_60 [8];
  Am_Value_List selected_objs;
  Am_Object local_40;
  Am_Object obj;
  Am_Value is_group;
  Am_Value *param_2_local;
  Am_Value *new_selection_local;
  Am_Object *command_obj_local;
  
  Am_Value::Am_Value((Am_Value *)&obj);
  Am_Object::Am_Object(&local_40);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_60);
  Am_Value_List::operator=((Am_Value_List *)local_60,new_selection);
  bVar1 = Am_Value_List::Empty((Am_Value_List *)local_60);
  if (bVar1) {
    command_obj_local._7_1_ = false;
  }
  else {
    Am_Value_List::Start((Am_Value_List *)local_60);
    while( true ) {
      bVar1 = Am_Value_List::Last((Am_Value_List *)local_60);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pAVar2 = Am_Value_List::Get((Am_Value_List *)local_60);
      Am_Object::operator=(&local_40,pAVar2);
      pAVar2 = Am_Object::Peek(&local_40,0x1e6,0);
      Am_Value::operator=((Am_Value *)&obj,pAVar2);
      bVar1 = Am_Value::Valid((Am_Value *)&obj);
      if (!bVar1) {
        command_obj_local._7_1_ = false;
        goto LAB_0031e7c7;
      }
      Am_Value_List::Next((Am_Value_List *)local_60);
    }
    command_obj_local._7_1_ =
         Am_Check_All_Objects_For_Inactive_Slot((Am_Value_List *)local_60,command_obj);
  }
LAB_0031e7c7:
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_60);
  Am_Object::~Am_Object(&local_40);
  Am_Value::~Am_Value((Am_Value *)&obj);
  return command_obj_local._7_1_;
}

Assistant:

Am_Define_Method(Am_Selective_New_Allowed_Method, bool,
                 ungroup_selective_repeat_new_allowed,
                 (Am_Object command_obj, Am_Value new_selection,
                  Am_Value /* new_value */))
{
  Am_Value is_group;
  Am_Object obj;
  Am_Value_List selected_objs;
  selected_objs = new_selection;
  if (selected_objs.Empty())
    return false;
  for (selected_objs.Start(); !selected_objs.Last(); selected_objs.Next()) {
    obj = selected_objs.Get();
    is_group = obj.Peek(Am_CREATED_GROUP);
    if (!is_group.Valid())
      return false;
  }
  return Am_Check_All_Objects_For_Inactive_Slot(selected_objs, command_obj);
}